

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

wstring * __thiscall
mjs::(anonymous_namespace)::stringify_state::nest::end_gap_abi_cxx11_
          (wstring *__return_storage_ptr__,void *this)

{
  ulong uVar1;
  allocator<wchar_t> local_19;
  void *local_18;
  nest *this_local;
  
  local_18 = this;
  this_local = (nest *)__return_storage_ptr__;
  uVar1 = std::__cxx11::wstring::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(__return_storage_ptr__,L"\n",
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   ((long)this + 8));
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"",&local_19);
    std::allocator<wchar_t>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring end_gap() const {
            return state_.gap_.empty() ? L"" : L"\n" + step_back_;
        }